

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::FormattingScene::Attribute
          (FormattingScene *this,string *target,ParsedParameterVector params,FileLoc loc)

{
  ostream *poVar1;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  string local_108;
  ParameterDictionary dict;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_80;
  
  local_108._M_dataplus._M_p = (pointer)pstd::pmr::new_delete_resource();
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_80,in_RDX,(polymorphic_allocator<pbrt::ParsedParameter_*> *)&local_108);
  ParameterDictionary::ParameterDictionary(&dict,&local_80,RGBColorSpace::sRGB);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_80);
  indent_abi_cxx11_(&local_108,this,0);
  Printf<std::__cxx11::string,std::__cxx11::string_const&>("%sAttribute \"%s\" ",&local_108,target);
  std::__cxx11::string::~string((string *)&local_108);
  if (in_RDX->nStored == 1) {
    ParameterDictionary::ToParameterList_abi_cxx11_(&local_108,&dict,0);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_108);
    std::operator<<(poVar1,'\n');
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,'\n');
    ParameterDictionary::ToParameterList_abi_cxx11_
              (&local_108,&dict,*(int *)&(this->super_SceneRepresentation).field_0xc);
    std::operator<<(poVar1,(string *)&local_108);
  }
  std::__cxx11::string::~string((string *)&local_108);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&dict.params);
  return;
}

Assistant:

void FormattingScene::Attribute(const std::string &target, ParsedParameterVector params,
                                FileLoc loc) {
    ParameterDictionary dict(params, RGBColorSpace::sRGB);
    Printf("%sAttribute \"%s\" ", indent(), target);
    if (params.size() == 1)
        // just one; put it on the same line
        std::cout << dict.ToParameterList(0) << '\n';
    else
        std::cout << '\n' << dict.ToParameterList(catIndentCount);
}